

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O2

bool __thiscall
dg::pta::PointerIdPointsToSet::addWithUnknownOffset(PointerIdPointsToSet *this,PSNode *node)

{
  bool bVar1;
  size_t i;
  Pointer local_28;
  
  local_28.offset.offset = Offset::UNKNOWN;
  local_28.target = node;
  i = getPointerID(&local_28);
  bVar1 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::get(&this->pointers,i);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    removeAny(this,node);
    bVar1 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::set(&this->pointers,i);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool addWithUnknownOffset(PSNode *node) {
        auto ptrid = getPointerID({node, Offset::UNKNOWN});
        if (!pointers.get(ptrid)) {
            removeAny(node);
            return !pointers.set(ptrid);
        }
        return false; // we already had it
    }